

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution1D::forward(Convolution1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *in_RDX;
  Option *unaff_RBX;
  long in_RDI;
  bool bVar3;
  int ret;
  int outw;
  int kernel_extent_w;
  size_t elemsize;
  int w;
  Mat bottom_blob_bordered;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  Mat *in_stack_fffffffffffffe88;
  Convolution1D *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  Mat *in_stack_fffffffffffffea0;
  Mat *pMVar4;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  Mat local_e0;
  Mat *local_90;
  int local_74;
  Mat *local_70;
  Mat *local_68;
  Mat *local_58;
  Mat *local_50;
  int local_38;
  undefined4 local_34;
  Mat *local_30;
  void *local_28;
  int in_stack_ffffffffffffffe0;
  int activation_type;
  Mat *in_stack_ffffffffffffffe8;
  Mat *in_stack_fffffffffffffff0;
  
  pMVar4 = &local_e0;
  local_e0.data = (void *)0x0;
  local_e0.refcount = (int *)0x0;
  local_e0.elemsize = 0;
  local_e0.elempack = 0;
  local_e0.allocator = (Allocator *)0x0;
  local_e0.dims = 0;
  local_e0.w = 0;
  local_e0.h = 0;
  local_e0.d = 0;
  local_e0.c = 0;
  local_e0.cstep = 0;
  local_90 = in_RDX;
  local_70 = pMVar4;
  make_padding(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               (Mat *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (Option *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  local_50 = &local_e0;
  if (local_e0.data != (void *)0x0) {
    in_stack_ffffffffffffffe8 = local_50;
  }
  activation_type = (int)in_stack_ffffffffffffffe8;
  if (local_e0.data != (void *)0x0 && local_e0.cstep * (long)local_e0.c != 0) {
    iVar1 = *(int *)(in_RDI + 0xd8) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
    iVar2 = (local_e0.w - iVar1) / *(int *)(in_RDI + 0xdc) + 1;
    Mat::create(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98,
                (size_t)in_stack_fffffffffffffe90,(Allocator *)in_stack_fffffffffffffe88);
    local_58 = local_90;
    bVar3 = true;
    if (local_90->data != (void *)0x0) {
      bVar3 = local_90->cstep * (long)local_90->c == 0;
      in_stack_fffffffffffffff0 = local_90;
    }
    if (bVar3) {
      local_74 = -100;
    }
    else {
      local_74 = convolution1d((Mat *)local_e0.elemsize,(Mat *)CONCAT44(iVar1,iVar2),
                               (Mat *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                               pMVar4,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                               in_stack_ffffffffffffffe0,activation_type,in_stack_fffffffffffffff0,
                               unaff_RBX);
      if (local_74 == 0) {
        local_74 = 0;
      }
    }
  }
  else {
    local_74 = -100;
  }
  pMVar4 = &local_e0;
  if (local_e0.refcount != (int *)0x0) {
    local_34 = 0xffffffff;
    LOCK();
    local_38 = *local_e0.refcount;
    *local_e0.refcount = *local_e0.refcount + -1;
    UNLOCK();
    if (local_38 == 1) {
      local_68 = pMVar4;
      local_30 = pMVar4;
      if (local_e0.allocator == (Allocator *)0x0) {
        local_28 = local_e0.data;
        if (local_e0.data != (void *)0x0) {
          free(local_e0.data);
        }
      }
      else {
        (*(local_e0.allocator)->_vptr_Allocator[3])(local_e0.allocator,local_e0.data);
      }
    }
  }
  pMVar4->data = (void *)0x0;
  pMVar4->elemsize = 0;
  pMVar4->elempack = 0;
  pMVar4->dims = 0;
  pMVar4->w = 0;
  pMVar4->h = 0;
  pMVar4->d = 0;
  pMVar4->c = 0;
  pMVar4->cstep = 0;
  pMVar4->refcount = (int *)0x0;
  return local_74;
}

Assistant:

int Convolution1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    const int w = bottom_blob_bordered.w;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;

    top_blob.create(outw, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int ret = convolution1d(bottom_blob_bordered, top_blob, weight_data, bias_data, kernel_w, stride_w, dilation_w, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    return 0;
}